

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_core_impl.hpp
# Opt level: O0

string * iutest::detail::MakePrefixedIndexTypedTestName<exception_value>
                   (string *__return_storage_ptr__,char *prefix,char *basename,size_t index)

{
  ulong uVar1;
  string local_60;
  allocator<char> local_2a;
  undefined1 local_29;
  size_t local_28;
  size_t index_local;
  char *basename_local;
  char *prefix_local;
  string *name;
  
  local_29 = 0;
  local_28 = index;
  index_local = (size_t)basename;
  basename_local = prefix;
  prefix_local = (char *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,prefix,&local_2a);
  std::allocator<char>::~allocator(&local_2a);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"/");
  }
  MakeIndexTypedTestName<exception_value>(&local_60,(char *)index_local,local_28);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  return __return_storage_ptr__;
}

Assistant:

::std::string MakePrefixedIndexTypedTestName(const char* prefix, const char* basename, size_t index)
{
#if IUTEST_HAS_RTTI
    ::std::string name = prefix;
    if( !name.empty() )
    {
        name += "/";
    }
    name += MakeIndexTypedTestName<T>(basename, index);
    return name;
#else
    return MakePrefixedIndexTestName(prefix, basename, index);
#endif
}